

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::CheckTypeStackEnd(TypeChecker *this,char *desc)

{
  Result RVar1;
  Label *in_RAX;
  Enum EVar2;
  bool bVar3;
  Label *local_28;
  Label *label;
  
  local_28 = in_RAX;
  RVar1 = GetLabel(this,0,&local_28);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    bVar3 = (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 2 != local_28->type_stack_limit;
    EVar2 = (Enum)bVar3;
    RVar1.enum_._1_3_ = 0;
    RVar1.enum_._0_1_ = bVar3;
    PrintStackIfFailed<>(this,RVar1,desc);
  }
  return (Result)EVar2;
}

Assistant:

Result TypeChecker::CheckTypeStackEnd(const char* desc) {
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  Result result = (type_stack_.size() == label->type_stack_limit)
                      ? Result::Ok
                      : Result::Error;
  PrintStackIfFailed(result, desc);
  return result;
}